

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  int iVar1;
  bool bVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  char *digits;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char buffer [18];
  undefined8 uStack_30;
  char acStack_28 [32];
  
  bVar3 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  iVar1 = *(int *)(this + 8);
  pcVar4 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar4 = "0123456789abcdef";
  }
  pcVar5 = acStack_28 + (long)iVar1 + -1;
  uVar6 = *(ulong *)(*(long *)this + 0x10);
  do {
    *pcVar5 = pcVar4[(uint)uVar6 & 0xf];
    pcVar5 = pcVar5 + -1;
    bVar2 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar2);
  uStack_30 = 0x1df9e5;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_28,acStack_28 + iVar1,bVar3);
  it->container = (list<char,_std::allocator<char>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }